

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall rcg::System::System(System *this,string *_filename)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  undefined8 uVar3;
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000048;
  GenTLWrapper *in_stack_00000050;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000560;
  string *in_stack_00000568;
  GenTLException *in_stack_00000570;
  GenTLWrapper *in_stack_ffffffffffffff48;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffff50;
  allocator *paVar4;
  allocator local_51;
  string local_50 [64];
  string *local_10;
  
  local_10 = in_RSI;
  std::enable_shared_from_this<rcg::System>::enable_shared_from_this
            ((enable_shared_from_this<rcg::System> *)0x13d569);
  std::__cxx11::string::string((string *)(in_RDI + 0x10));
  std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x13d58f);
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x13d59d);
  std::shared_ptr<rcg::CPort>::shared_ptr((shared_ptr<rcg::CPort> *)0x13d5b0);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x13d5c6);
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          *)0x13d5dc);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),local_10);
  operator_new(0x1d0);
  GenTLWrapper::GenTLWrapper(in_stack_00000050,in_stack_00000048);
  std::shared_ptr<rcg::GenTLWrapper_const>::shared_ptr<rcg::GenTLWrapper,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::shared_ptr<const_rcg::GenTLWrapper>::operator=
            (in_stack_ffffffffffffff50,
             (shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff48);
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x13d654);
  peVar2 = std::
           __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13d65e);
  GVar1 = (*peVar2->GCInitLib)();
  if (GVar1 != 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    paVar4 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"System::System()",paVar4);
    GenTLException::GenTLException(in_stack_00000570,in_stack_00000568,in_stack_00000560);
    __cxa_throw(uVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

System::System(const std::string &_filename)
{
  filename=_filename;

  gentl=std::shared_ptr<const GenTLWrapper>(new GenTLWrapper(filename));

  if (gentl->GCInitLib() != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("System::System()", gentl);
  }

  n_open=0;
  tl=0;
}